

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O3

int __thiscall pstore::brokerface::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  update_callback *puVar3;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  p_Var1 = *(_Invoker_type *)(uis + 0x18);
  p_Var2 = *(_Manager_type *)(uis + 0x10);
  if (p_Var2 != (_Manager_type)0x0) {
    local_38 = *(undefined8 *)uis;
    uStack_30 = *(undefined8 *)(uis + 8);
    *(undefined8 *)(uis + 0x10) = 0;
    *(undefined8 *)(uis + 0x18) = 0;
  }
  this->_vptr_writer = (_func_int **)&PTR__writer_00159298;
  fifo_path::open_client_pipe((fifo_path *)&this->fd_);
  puVar3 = (update_callback *)0x0;
  (this->retry_timeout_).__r = 0;
  this->max_retries_ = 0;
  *(undefined8 *)&(this->update_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = 0;
  (this->update_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->update_cb_)._M_invoker = p_Var1;
  if (p_Var2 != (_Manager_type)0x0) {
    puVar3 = &this->update_cb_;
    *(undefined8 *)&(puVar3->super__Function_base)._M_functor = local_38;
    *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = uStack_30;
    (this->update_cb_).super__Function_base._M_manager = p_Var2;
  }
  return (int)puVar3;
}

Assistant:

writer::writer (fifo_path const & fifo, update_callback cb)
                : writer (fifo, duration_type{0}, 0U, std::move (cb)) {}